

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

SmartPointer<GEO::ThreadManager> * __thiscall
GEO::SmartPointer<GEO::ThreadManager>::operator=
          (SmartPointer<GEO::ThreadManager> *this,ThreadManager *ptr)

{
  ThreadManager *ptr_local;
  SmartPointer<GEO::ThreadManager> *this_local;
  
  if (ptr != this->pointer_) {
    Counted::unref(&this->pointer_->super_Counted);
    this->pointer_ = ptr;
    Counted::ref(&this->pointer_->super_Counted);
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }